

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O2

bool anon_unknown.dwarf_156bd::SolverDpllTriadSimd<2>::BoxRestrict<1>
               (State *state,int box_idx,Cells16 *candidates)

{
  undefined1 auVar1 [32];
  int box_i;
  int box_j;
  undefined1 auVar2 [32];
  undefined8 uVar3;
  bool bVar4;
  long lVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  Bitvec16x16 eliminating;
  Cells16 local_a0;
  Cells16 local_80 [2];
  
  lVar5 = (long)box_idx;
  auVar1 = *(undefined1 (*) [32])state->boxen[lVar5].cells.vec;
  if ((auVar1 & ~*(undefined1 (*) [32])candidates->vec) == (undefined1  [32])0x0) {
    return true;
  }
  local_a0.vec = (__m256i)vpandn_avx2(*(undefined1 (*) [32])candidates->vec,auVar1);
  auVar11 = vpmovsxbw_avx2(_DAT_0010ab50);
  box_i = *(int *)((anonymous_namespace)::tables + lVar5 * 4 + 0x18b8);
  box_j = *(int *)((anonymous_namespace)::tables + lVar5 * 4 + 0x18dc);
  do {
    auVar1 = vpandn_avx2((undefined1  [32])local_a0.vec,auVar1);
    auVar6 = vpopcntw_avx512_bitalg(auVar1);
    *(undefined1 (*) [32])state->boxen[lVar5].cells.vec = auVar1;
    uVar3 = vpcmpw_avx512vl(auVar6,auVar11,1);
    if ((short)uVar3 != 0) goto LAB_00108e36;
    auVar11 = vpcmpeqw_avx2(auVar6,auVar11);
    auVar7 = vprolq_avx512vl(auVar1,0x10);
    auVar8 = vprolq_avx512vl(auVar1,0x20);
    auVar9 = vprolq_avx512vl(auVar1,0x30);
    auVar2 = vpermq_avx2(auVar1,0x93);
    auVar11 = vpand_avx2(auVar1,auVar11);
    auVar6 = vpand_avx2(auVar7,auVar1);
    auVar7 = vpor_avx2(auVar7,auVar1);
    auVar10 = vpternlogd_avx512vl(auVar6,auVar8,auVar7,0xf8);
    auVar6 = vpor_avx2(auVar8,auVar7);
    auVar6 = vpternlogd_avx512vl(auVar9,auVar6,auVar10,0xea);
    auVar7 = vpermq_avx2(auVar1,0x4e);
    auVar8 = vpternlogd_avx512vl(auVar6,auVar1,auVar11,0xae);
    auVar6 = vpermq_avx2(auVar1,0x39);
    auVar11 = vpand_avx2(auVar6,auVar1);
    auVar6 = vpor_avx2(auVar6,auVar1);
    auVar9 = vpternlogd_avx512vl(auVar11,auVar7,auVar6,0xf8);
    auVar11 = vpor_avx2(auVar7,auVar6);
    auVar11 = vpternlogd_avx512vl(auVar2,auVar11,auVar9,0xea);
    local_80[0].vec = (__m256i)vpternlogd_avx512vl(auVar11,auVar1,auVar8,0xae);
    AssertionsToEliminations
              (local_80,box_i,box_j,&local_a0,&state->bands[0][box_i].eliminations,
               (Cells08 *)(state->boxen[(long)box_j + -3].cells.vec + 2));
    auVar1 = *(undefined1 (*) [32])state->boxen[lVar5].cells.vec;
    auVar11 = vpmovsxbw_avx2(_DAT_0010ab50);
  } while ((auVar1 & (undefined1  [32])local_a0.vec) != (undefined1  [32])0x0);
  bVar4 = BandEliminate<0>(state,box_i,box_j);
  if (bVar4) {
    bVar4 = BandEliminate<1>(state,box_j,box_i);
  }
  else {
LAB_00108e36:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

static bool BoxRestrict(State &state, int box_idx, const Cells16 &candidates) {
        // return immediately if there are no new eliminations
        Box &box = state.boxen[box_idx];
        if (box.cells.SubsetOf(candidates)) return true;
        auto eliminating = box.cells.and_not(candidates);

        int box_i = tables.div3[box_idx];
        int box_j = tables.mod3[box_idx];

        Band &h_band = state.bands[0][box_i];
        Band &v_band = state.bands[1][box_j];
        do {
            // apply eliminations and check that no cell clause now violates its minimum
            box.cells = box.cells.and_not(eliminating);
            Cells16 counts = box.cells.Popcounts9();
            const Cells16 box_minimums{1, 1, 1, 6, 1, 1, 1, 6, 1, 1, 1, 6, 6, 6, 6, 0};
            if (counts.AnyLessThan(box_minimums)) return false;

            // gather literals asserted by triggered cell clauses
            Cells16 triggered = counts.WhichEqual(box_minimums);
            Cells16 all_assertions = box.cells & triggered;
            // and add literals asserted by triggered triad definition clauses
            GatherTriadClauseAssertions(
                    box.cells, [](const Cells16 &x) { return x.RotateRows(); }, all_assertions);
            GatherTriadClauseAssertions(
                    box.cells, [](const Cells16 &x) { return x.RotateCols(); }, all_assertions);

            // construct elimination messages for this box and for our band peers
            AssertionsToEliminations(all_assertions, box_i, box_j, eliminating,
                                     h_band.eliminations, v_band.eliminations);

        } while (eliminating.Intersects(box.cells));

        // send elimination messages to horizontal and vertical peers. Prefer to send the first
        // of these messages to the peer whose orientation is opposite that of the inbound peer.
        if (from_vertical) {
            return BandEliminate<0>(state, box_i, box_j) &&
                   BandEliminate<1>(state, box_j, box_i);
        } else {
            return BandEliminate<1>(state, box_j, box_i) &&
                   BandEliminate<0>(state, box_i, box_j);
        }
    }